

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serve_dynamic_content.hpp
# Opt level: O3

container *
pstore::http::details::
get_commands<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (void)

{
  int iVar1;
  
  if (get_commands<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,-1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>()
      ::commands_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&get_commands<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,-1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>()
                                 ::commands_abi_cxx11_);
    if (iVar1 != 0) {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>_(pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<const_unsigned_char,_-1L>_&),_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
      ::
      pair<const_char_(&)[8],_pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>_(&)(pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<const_unsigned_char,__1L>_&),_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_true>
                (get_commands<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,-1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>()
                 ::commands_abi_cxx11_._M_elems,(char (*) [8])0x13fd24,
                 handle_version<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                );
      __cxa_atexit(std::
                   array<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>_(pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<const_unsigned_char,_-1L>_&),_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>,_1UL>
                   ::~array,&get_commands<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,-1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>()
                             ::commands_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&get_commands<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,-1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>()
                           ::commands_abi_cxx11_);
    }
  }
  return &get_commands<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,-1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>()
          ::commands_abi_cxx11_;
}

Assistant:

typename commands_helper<Sender, IO>::container const & get_commands () {
                static typename commands_helper<Sender, IO>::container const commands = {
                    {{"version", handle_version<Sender, IO>}},
                };
                return commands;
            }